

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O0

error_code slang::OS::readFile(path *path,SmallVector<char,_40UL> *buffer)

{
  bool bVar1;
  int iVar2;
  char *__file;
  int *piVar3;
  error_category *peVar4;
  unsigned_long *puVar5;
  ssize_t sVar6;
  reference pcVar7;
  pointer pcVar8;
  SmallVectorBase<char> *in_RSI;
  path *in_RDI;
  error_code eVar9;
  ssize_t numRead_1;
  size_t currSize;
  ssize_t numRead;
  size_t bytesToRead;
  char *buf;
  size_t fileSize;
  stat status;
  bool isStdin;
  string_type *pathStr;
  int fd;
  error_code ec;
  char *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  long local_f8;
  unsigned_long local_e8;
  size_t local_e0;
  pointer local_d8;
  unsigned_long local_d0;
  stat local_c8;
  byte local_31;
  string_type *local_30;
  int local_24;
  SmallVectorBase<char> *local_20;
  error_code local_10;
  
  local_20 = in_RSI;
  local_30 = std::filesystem::__cxx11::path::native(in_RDI);
  local_31 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffec8);
  if ((bool)local_31) {
    local_24 = 0;
LAB_004061d8:
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    iVar2 = fstat(local_24,&local_c8);
    if (iVar2 == 0) {
      if (((local_c8.st_mode & 0xf000) == 0x8000) || ((local_c8.st_mode & 0xf000) == 0x6000)) {
        local_d0 = local_c8.st_size;
        SmallVectorBase<char>::resize_for_overwrite
                  ((SmallVectorBase<char> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_type)in_stack_fffffffffffffec8);
        local_d8 = SmallVectorBase<char>::data(local_20);
        do {
          while( true ) {
            if (local_d0 == 0) goto LAB_0040636e;
            local_e8 = 0x7fffffff;
            puVar5 = std::min<unsigned_long>(&local_d0,&local_e8);
            local_e0 = *puVar5;
            sVar6 = read(local_24,local_d8,local_e0);
            if (-1 < sVar6) break;
            piVar3 = __errno_location();
            if (*piVar3 != 4) {
              piVar3 = __errno_location();
              iVar2 = *piVar3;
              peVar4 = (error_category *)std::_V2::generic_category();
              std::error_code::assign(&local_10,iVar2,peVar4);
              goto LAB_0040636e;
            }
          }
          local_d8 = local_d8 + sVar6;
          local_d0 = local_d0 - sVar6;
        } while (sVar6 != 0);
        SmallVectorBase<char>::data(local_20);
        SmallVectorBase<char>::resize
                  ((SmallVectorBase<char> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_type)in_stack_fffffffffffffec8);
LAB_0040636e:
        pcVar7 = SmallVectorBase<char>::back(local_20);
        *pcVar7 = '\0';
      }
      else {
        local_f8 = 0;
        do {
          while( true ) {
            SmallVectorBase<char>::resize_for_overwrite
                      ((SmallVectorBase<char> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (size_type)in_stack_fffffffffffffec8);
            iVar2 = local_24;
            pcVar8 = SmallVectorBase<char>::data(local_20);
            sVar6 = read(iVar2,pcVar8 + local_f8,0x4000);
            if (-1 < sVar6) break;
            piVar3 = __errno_location();
            if (*piVar3 != 4) {
              piVar3 = __errno_location();
              iVar2 = *piVar3;
              peVar4 = (error_category *)std::_V2::generic_category();
              std::error_code::assign(&local_10,iVar2,peVar4);
              goto LAB_00406434;
            }
          }
          local_f8 = sVar6 + local_f8;
        } while (sVar6 != 0);
LAB_00406434:
        SmallVectorBase<char>::resize
                  ((SmallVectorBase<char> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_type)in_stack_fffffffffffffec8);
        pcVar7 = SmallVectorBase<char>::back(local_20);
        *pcVar7 = '\0';
      }
    }
    else {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      peVar4 = (error_category *)std::_V2::generic_category();
      std::error_code::assign(&local_10,iVar2,peVar4);
    }
    if ((((local_31 & 1) == 0) && (iVar2 = close(local_24), iVar2 < 0)) &&
       (bVar1 = std::error_code::operator_cast_to_bool(&local_10), !bVar1)) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      peVar4 = (error_category *)std::_V2::generic_category();
      std::error_code::assign(&local_10,iVar2,peVar4);
    }
  }
  else {
    do {
      __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      local_24 = open(__file,0x80000);
      if (-1 < local_24) goto LAB_004061d8;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    peVar4 = (error_category *)std::_V2::generic_category();
    std::error_code::error_code(&local_10,iVar2,peVar4);
  }
  eVar9._4_4_ = 0;
  eVar9._M_value = local_10._M_value;
  eVar9._M_cat = local_10._M_cat;
  return eVar9;
}

Assistant:

std::error_code OS::readFile(const fs::path& path, SmallVector<char>& buffer) {
    int fd;
    auto& pathStr = path.native();
    const bool isStdin = pathStr == "-";

    if (isStdin) {
        fd = STDIN_FILENO;
    }
    else {
        while (true) {
            fd = ::open(pathStr.c_str(), O_RDONLY | O_CLOEXEC);
            if (fd >= 0)
                break;

            if (errno != EINTR)
                return std::error_code(errno, std::generic_category());
        }
    }

    std::error_code ec;
    struct stat status;
    if (::fstat(fd, &status) != 0) {
        ec.assign(errno, std::generic_category());
    }
    else if (S_ISREG(status.st_mode) || S_ISBLK(status.st_mode)) {
        auto fileSize = (size_t)status.st_size;
        buffer.resize_for_overwrite(fileSize + 1);

        char* buf = buffer.data();
        while (fileSize) {
            size_t bytesToRead = std::min(fileSize, size_t(INT32_MAX));
            ssize_t numRead = ::read(fd, buf, bytesToRead);
            if (numRead < 0) {
                if (errno == EINTR)
                    continue;

                ec.assign(errno, std::generic_category());
                break;
            }

            buf += numRead;
            fileSize -= (size_t)numRead;
            if (numRead == 0) {
                // We reached the end of the file early -- it must have been
                // truncated by someone else.
                buffer.resize(size_t(buf - buffer.data()) + 1);
                break;
            }
        }

        buffer.back() = '\0';
    }
    else {
        static constexpr size_t ChunkSize = 4 * 4096;

        size_t currSize = 0;
        while (true) {
            buffer.resize_for_overwrite(currSize + ChunkSize + 1);

            ssize_t numRead = ::read(fd, buffer.data() + currSize, ChunkSize);
            if (numRead < 0) {
                if (errno == EINTR)
                    continue;

                ec.assign(errno, std::generic_category());
                break;
            }

            currSize += (size_t)numRead;
            if (numRead == 0)
                break;
        }

        buffer.resize(currSize + 1);
        buffer.back() = '\0';
    }

    if (!isStdin) {
        if (::close(fd) < 0 && !ec)
            ec.assign(errno, std::generic_category());
    }

    return ec;
}